

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_bloomshader.cpp
# Opt level: O3

void __thiscall FBloomExtractShader::Bind(FBloomExtractShader *this)

{
  FShaderProgram *this_00;
  GLint GVar1;
  
  this_00 = &this->mShader;
  if ((this->mShader).mProgram == 0) {
    FShaderProgram::Compile(this_00,Vertex,"shaders/glsl/screenquad.vp",(char *)"",0x14a);
    FShaderProgram::Compile(this_00,Fragment,"shaders/glsl/bloomextract.fp",(char *)"",0x14a);
    FShaderProgram::SetFragDataLocation(this_00,0,"FragColor");
    FShaderProgram::Link(this_00,"shaders/glsl/bloomextract");
    FShaderProgram::SetAttribLocation(this_00,0,"PositionInProjection");
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"SceneTexture");
    (this->SceneTexture).mIndex = GVar1;
    (this->SceneTexture).mBuffer = -1;
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"ExposureAdjustment");
    (this->Exposure).mIndex = GVar1;
    (this->Exposure).mBuffer = 0.0;
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"Scale");
    (this->Scale).mIndex = GVar1;
    (this->Scale).mBuffer[0] = 0.0;
    (this->Scale).mBuffer[1] = 0.0;
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"Offset");
    (this->Offset).mIndex = GVar1;
    (this->Offset).mBuffer[0] = 0.0;
    (this->Offset).mBuffer[1] = 0.0;
  }
  FShaderProgram::Bind(this_00);
  return;
}

Assistant:

void FBloomExtractShader::Bind()
{
	if (!mShader)
	{
		mShader.Compile(FShaderProgram::Vertex, "shaders/glsl/screenquad.vp", "", 330);
		mShader.Compile(FShaderProgram::Fragment, "shaders/glsl/bloomextract.fp", "", 330);
		mShader.SetFragDataLocation(0, "FragColor");
		mShader.Link("shaders/glsl/bloomextract");
		mShader.SetAttribLocation(0, "PositionInProjection");
		SceneTexture.Init(mShader, "SceneTexture");
		Exposure.Init(mShader, "ExposureAdjustment");
		Scale.Init(mShader, "Scale");
		Offset.Init(mShader, "Offset");
	}
	mShader.Bind();
}